

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fssocks.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Config *this;
  EventLoop *this_00;
  DNSResolve *this_01;
  TCPRelay *this_02;
  UDPRelay *this_03;
  string *this_04;
  allocator local_290;
  allocator local_28f;
  allocator local_28e;
  allocator local_28d;
  allocator local_28c;
  allocator local_28b;
  allocator local_28a;
  allocator local_289;
  value_type local_288;
  string local_268;
  string local_248;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dns_servers;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this = (Config *)operator_new(0x30);
  Config::Config(this,argc,argv);
  std::__cxx11::string::string((string *)&local_50,"is_local",(allocator *)&local_288);
  iVar2 = Config::GetInt(this,&local_50,0);
  std::__cxx11::string::~string((string *)&local_50);
  dns_servers.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&dns_servers;
  dns_servers.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  dns_servers.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       dns_servers.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::string((string *)&local_288,"114.114.114.114",(allocator *)&local_268);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&dns_servers,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  this_00 = (EventLoop *)operator_new(0x78);
  EventLoop::EventLoop(this_00);
  this_01 = (DNSResolve *)operator_new(0x218);
  DNSResolve::DNSResolve(this_01,&dns_servers);
  this_02 = (TCPRelay *)operator_new(0x68);
  TCPRelay::TCPRelay(this_02,this,this_01,iVar2 == 1);
  this_03 = (UDPRelay *)operator_new(0x170);
  UDPRelay::UDPRelay(this_03,this,this_01,iVar2 == 1);
  DNSResolve::AddToLoop(this_01,this_00);
  bVar1 = TCPRelay::Init(this_02);
  if (bVar1) {
    bVar1 = UDPRelay::Init(this_03);
    if (bVar1) {
      if (iVar2 == 1) {
        Log::GetInstance();
        Log::FormatTime_abi_cxx11_();
        std::operator<<((ostream *)&std::cout,(string *)&local_288);
        std::operator<<((ostream *)&std::cout," [info] ");
        std::operator<<((ostream *)&std::cout,"listen ");
        std::__cxx11::string::string((string *)&local_70,"local_address",&local_28f);
        std::__cxx11::string::string((string *)&local_90,"",&local_290);
        Config::GetStr(&local_268,this,&local_70,&local_90);
        std::operator<<((ostream *)&std::cout,(string *)&local_268);
        std::operator<<((ostream *)&std::cout,":");
        std::__cxx11::string::string((string *)&local_b0,"local_port",&local_289);
        std::__cxx11::string::string((string *)&local_d0,"",&local_28a);
        Config::GetStr(&local_248,this,&local_b0,&local_d0);
        std::operator<<((ostream *)&std::cout,(string *)&local_248);
        std::operator<<((ostream *)&std::cout," forward to ");
        std::__cxx11::string::string((string *)&local_f0,"server_address",&local_28b);
        std::__cxx11::string::string((string *)&local_110,"",&local_28c);
        Config::GetStr(&local_1f0,this,&local_f0,&local_110);
        std::operator<<((ostream *)&std::cout,(string *)&local_1f0);
        std::operator<<((ostream *)&std::cout,":");
        std::__cxx11::string::string((string *)&local_130,"server_port",&local_28d);
        std::__cxx11::string::string((string *)&local_150,"",&local_28e);
        Config::GetStr(&local_210,this,&local_130,&local_150);
        std::operator<<((ostream *)&std::cout,(string *)&local_210);
        std::operator<<((ostream *)&std::cout,"\n");
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_90);
        this_04 = &local_70;
      }
      else {
        Log::GetInstance();
        Log::FormatTime_abi_cxx11_();
        std::operator<<((ostream *)&std::cout,(string *)&local_288);
        std::operator<<((ostream *)&std::cout," [info] ");
        std::operator<<((ostream *)&std::cout,"listen ");
        std::__cxx11::string::string((string *)&local_170,"server_address",(allocator *)&local_1f0);
        std::__cxx11::string::string((string *)&local_190,"",(allocator *)&local_210);
        Config::GetStr(&local_268,this,&local_170,&local_190);
        std::operator<<((ostream *)&std::cout,(string *)&local_268);
        std::operator<<((ostream *)&std::cout,":");
        std::__cxx11::string::string((string *)&local_1b0,"server_port",&local_28f);
        std::__cxx11::string::string((string *)&local_1d0,"",&local_290);
        Config::GetStr(&local_248,this,&local_1b0,&local_1d0);
        std::operator<<((ostream *)&std::cout,(string *)&local_248);
        std::operator<<((ostream *)&std::cout,"\n");
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_190);
        this_04 = &local_170;
      }
      std::__cxx11::string::~string((string *)this_04);
      std::__cxx11::string::~string((string *)&local_288);
      TCPRelay::AddToLoop(this_02,this_00);
      UDPRelay::AddToLoop(this_03,this_00);
      EventLoop::Run(this_00);
    }
  }
  Log::GetInstance();
  Log::FormatTime_abi_cxx11_();
  std::operator<<((ostream *)&std::cout,(string *)&local_288);
  std::operator<<((ostream *)&std::cout," [error] ");
  std::operator<<((ostream *)&std::cout,"error occurred, exit...\n");
  std::__cxx11::string::~string((string *)&local_288);
  TCPRelay::Close(this_02);
  (*(this_02->super_ISockNotify)._vptr_ISockNotify[1])(this_02);
  if (this_03 != (UDPRelay *)0x0) {
    (*(this_03->super_ISockNotify)._vptr_ISockNotify[1])(this_03);
  }
  if (this_01 != (DNSResolve *)0x0) {
    DNSResolve::Close(this_01);
    (*(this_01->super_ISockNotify)._vptr_ISockNotify[1])(this_01);
  }
  if (this_00 != (EventLoop *)0x0) {
    EventLoop::~EventLoop(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&dns_servers.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
#ifdef _WIN32
    int err = 0;
    WSADATA wsaData;
    if (0 != (err = WSAStartup(MAKEWORD(2, 2), &wsaData)))
    {
        WSASetLastError(err);
        return 1;
    }
#endif
    //server --server -p 8881 -s 0.0.0.0
    //		   --server --server-port 8881 --server-address 0.0.0.0
    //client --client -p 8881 -l 1081 -s 127.0.0.1 -b 127.0.0.1
    //		   --client --server-port 8881 --server-address 127.0.0.1 --local-port 1081 --local-address 127.0.0.1
    //parse command line
    Config* config = new Config(argc, argv);
    bool is_local = config->GetInt("is_local") == 1;

    list<string> dns_servers;
    dns_servers.push_back("114.114.114.114");
    DNSResolve* dns_resolver = NULL;

    EventLoop* event_loop = NULL;
    TCPRelay* tcp_server = NULL;
    UDPRelay* udp_server = NULL;
    try
    {
        event_loop = new EventLoop();
        dns_resolver = new DNSResolve(dns_servers);
        tcp_server = new TCPRelay(config, dns_resolver, is_local);
        udp_server = new UDPRelay(config, dns_resolver, is_local);
        dns_resolver->AddToLoop(event_loop);
        if (tcp_server->Init() && udp_server->Init())
        {
            if (is_local)
                LOGI << "listen " << config->GetStr("local_address") << ":" << config->GetStr("local_port") <<
                     " forward to " << config->GetStr("server_address") << ":" << config->GetStr("server_port") << "\n";
            else
                LOGI << "listen " << config->GetStr("server_address") << ":" << config->GetStr("server_port") << "\n";
            tcp_server->AddToLoop(event_loop);
            udp_server->AddToLoop(event_loop);
            event_loop->Run();
        }
        LOGE << "error occurred, exit...\n";
    }
    catch (const std::exception&)
    {
        LOGE << "exception occurred, exit...\n";
    }
    if (tcp_server)
    {
        tcp_server->Close();
        delete tcp_server;
        tcp_server = NULL;
    }
    if (udp_server)
    {
        delete udp_server;
        udp_server = NULL;
    }
    if (dns_resolver)
    {
        dns_resolver->Close();
        delete dns_resolver;
        dns_resolver = NULL;
    }
    if (event_loop)
    {
        delete event_loop;
        event_loop = NULL;
    }
    return 0;
}